

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O1

void __thiscall
slang::ast::ParameterBuilder::ParameterBuilder
          (ParameterBuilder *this,Scope *scope,string_view definitionName,
          span<const_slang::ast::DefinitionSymbol::ParameterDecl,_18446744073709551615UL>
          parameterDecls)

{
  undefined8 uVar1;
  
  this->scope = scope;
  (this->definitionName)._M_len = definitionName._M_len;
  (this->definitionName)._M_str = definitionName._M_str;
  (this->parameterDecls)._M_ptr = parameterDecls._M_ptr;
  (this->parameterDecls)._M_extent._M_extent_value =
       parameterDecls._M_extent._M_extent_value._M_extent_value;
  (this->assignments).super_Storage.ptr = (char *)&this->assignments;
  *(SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
    **)&(this->assignments).super_Storage.field_0x108 = &this->assignments;
  *(undefined8 *)&(this->assignments).field_0x110 = 0x3f;
  *(undefined8 *)&(this->assignments).field_0x118 = 1;
  *(undefined8 *)&(this->assignments).field_0x120 = 0;
  *(undefined8 *)&(this->assignments).field_0x128 = 0;
  *(undefined1 **)&(this->assignments).field_0x120 =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  uVar1 = 0x1d;
  if (*(long *)&(this->assignments).field_0x128 == 0) {
    uVar1 = 0;
  }
  *(undefined8 *)&(this->assignments).field_0x130 = uVar1;
  *(undefined8 *)&(this->assignments).field_0x138 = 0;
  this->instanceContext = (ASTContext *)0x0;
  this->overrideNode = (HierarchyOverrideNode *)0x0;
  this->configScope = (Scope *)0x0;
  *(undefined4 *)((long)&this->configScope + 7) = 0;
  return;
}

Assistant:

ParameterBuilder::ParameterBuilder(const Scope& scope, std::string_view definitionName,
                                   std::span<const Decl> parameterDecls) :
    scope(scope), definitionName(definitionName), parameterDecls(parameterDecls) {
}